

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O3

FRAME_STATS *
accumulate_frame_stats
          (FRAME_STATS *__return_storage_ptr__,FRAME_STATS *mb_stats,int mb_rows,int mb_cols)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  FRAME_STATS *in_RAX;
  int iVar4;
  int iVar5;
  int iVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int local_70;
  int local_6c;
  int local_64;
  long local_60;
  
  lVar17 = 0;
  lVar18 = 0;
  __return_storage_ptr__->neutral_count = 0.0;
  __return_storage_ptr__->intra_skip_count = 0;
  __return_storage_ptr__->image_data_start_row = 0;
  __return_storage_ptr__->sum_mvcs = 0;
  __return_storage_ptr__->intra_factor = 0.0;
  __return_storage_ptr__->sum_mvr_abs = 0;
  __return_storage_ptr__->sum_mvc_abs = 0;
  __return_storage_ptr__->sum_mvrs = 0;
  __return_storage_ptr__->new_mv_count = 0;
  __return_storage_ptr__->sum_in_vectors = 0;
  __return_storage_ptr__->sum_mvr = 0;
  __return_storage_ptr__->sum_mvc = 0;
  __return_storage_ptr__->mv_count = 0;
  __return_storage_ptr__->inter_count = 0;
  __return_storage_ptr__->second_ref_count = 0;
  *(undefined4 *)&__return_storage_ptr__->field_0x2c = 0;
  __return_storage_ptr__->coded_error = 0;
  __return_storage_ptr__->sr_coded_error = 0;
  __return_storage_ptr__->intra_error = 0;
  __return_storage_ptr__->frame_avg_wavelet_energy = 0;
  __return_storage_ptr__->brightness_factor = 0.0;
  __return_storage_ptr__->image_data_start_row = -1;
  if (0 < mb_rows) {
    pdVar7 = &mb_stats->brightness_factor;
    local_64 = -1;
    dVar19 = 0.0;
    lVar12 = 0;
    iVar13 = 0;
    iVar6 = 0;
    local_60 = 0;
    local_6c = 0;
    local_70 = 0;
    iVar16 = 0;
    lVar14 = 0;
    iVar15 = 0;
    in_RAX = (FRAME_STATS *)0x0;
    iVar4 = 0;
    iVar5 = 0;
    dVar20 = 0.0;
    dVar21 = 0.0;
    lVar8 = 0;
    iVar11 = 0;
    uVar10 = 0;
    do {
      if (0 < mb_cols) {
        lVar9 = 0;
        do {
          iVar2 = *(int *)((long)pdVar7 + lVar9 + -0x34);
          if (iVar2 != -1 && local_64 == -1) {
            __return_storage_ptr__->image_data_start_row = iVar2;
            local_64 = iVar2;
          }
          plVar1 = (long *)((long)pdVar7 + lVar9 + -0x68);
          lVar17 = lVar17 + *plVar1;
          lVar18 = lVar18 + plVar1[1];
          dVar21 = dVar21 + *(double *)((long)pdVar7 + lVar9);
          iVar11 = iVar11 + *(int *)((long)pdVar7 + lVar9 + -0x4c);
          lVar8 = lVar8 + *(long *)((long)pdVar7 + lVar9 + -0x70);
          dVar20 = dVar20 + *(double *)((long)pdVar7 + lVar9 + -8);
          iVar5 = iVar5 + *(int *)((long)pdVar7 + lVar9 + -0x38);
          iVar4 = iVar4 + *(int *)((long)pdVar7 + lVar9 + -0x50);
          dVar19 = dVar19 + *(double *)((long)pdVar7 + lVar9 + -0x40);
          uVar3 = (int)in_RAX + *(int *)((long)pdVar7 + lVar9 + -0x30);
          in_RAX = (FRAME_STATS *)(ulong)uVar3;
          iVar15 = iVar15 + *(int *)((long)pdVar7 + lVar9 + -0x48);
          lVar14 = lVar14 + *(long *)((long)pdVar7 + lVar9 + -0x58);
          iVar16 = iVar16 + *(int *)((long)pdVar7 + lVar9 + -0x2c);
          local_70 = local_70 + *(int *)((long)pdVar7 + lVar9 + -0x24);
          local_6c = local_6c + *(int *)((long)pdVar7 + lVar9 + -0x1c);
          local_60 = local_60 + *(long *)((long)pdVar7 + lVar9 + -0x10);
          iVar6 = iVar6 + *(int *)((long)pdVar7 + lVar9 + -0x28);
          iVar13 = iVar13 + *(int *)((long)pdVar7 + lVar9 + -0x20);
          lVar12 = lVar12 + *(long *)((long)pdVar7 + lVar9 + -0x18);
          lVar9 = lVar9 + 0x78;
        } while ((ulong)(uint)mb_cols * 0x78 != lVar9);
        __return_storage_ptr__->brightness_factor = dVar21;
        __return_storage_ptr__->frame_avg_wavelet_energy = lVar17;
        __return_storage_ptr__->coded_error = lVar18;
        __return_storage_ptr__->inter_count = iVar11;
        __return_storage_ptr__->intra_error = lVar8;
        __return_storage_ptr__->intra_factor = dVar20;
        __return_storage_ptr__->intra_skip_count = iVar5;
        __return_storage_ptr__->mv_count = iVar4;
        __return_storage_ptr__->neutral_count = dVar19;
        __return_storage_ptr__->new_mv_count = uVar3;
        __return_storage_ptr__->second_ref_count = iVar15;
        __return_storage_ptr__->sr_coded_error = lVar14;
        __return_storage_ptr__->sum_in_vectors = iVar16;
        __return_storage_ptr__->sum_mvc = local_70;
        __return_storage_ptr__->sum_mvc_abs = local_6c;
        __return_storage_ptr__->sum_mvcs = local_60;
        __return_storage_ptr__->sum_mvr = iVar6;
        __return_storage_ptr__->sum_mvr_abs = iVar13;
        __return_storage_ptr__->sum_mvrs = lVar12;
      }
      uVar10 = uVar10 + 1;
      pdVar7 = pdVar7 + (ulong)(uint)mb_cols * 0xf;
    } while (uVar10 != (uint)mb_rows);
  }
  return in_RAX;
}

Assistant:

static FRAME_STATS accumulate_frame_stats(FRAME_STATS *mb_stats, int mb_rows,
                                          int mb_cols) {
  FRAME_STATS stats = { 0 };
  int i, j;

  stats.image_data_start_row = INVALID_ROW;
  for (j = 0; j < mb_rows; j++) {
    for (i = 0; i < mb_cols; i++) {
      FRAME_STATS mb_stat = mb_stats[j * mb_cols + i];
      stats.brightness_factor += mb_stat.brightness_factor;
      stats.coded_error += mb_stat.coded_error;
      stats.frame_avg_wavelet_energy += mb_stat.frame_avg_wavelet_energy;
      if (stats.image_data_start_row == INVALID_ROW &&
          mb_stat.image_data_start_row != INVALID_ROW) {
        stats.image_data_start_row = mb_stat.image_data_start_row;
      }
      stats.inter_count += mb_stat.inter_count;
      stats.intra_error += mb_stat.intra_error;
      stats.intra_factor += mb_stat.intra_factor;
      stats.intra_skip_count += mb_stat.intra_skip_count;
      stats.mv_count += mb_stat.mv_count;
      stats.neutral_count += mb_stat.neutral_count;
      stats.new_mv_count += mb_stat.new_mv_count;
      stats.second_ref_count += mb_stat.second_ref_count;
      stats.sr_coded_error += mb_stat.sr_coded_error;
      stats.sum_in_vectors += mb_stat.sum_in_vectors;
      stats.sum_mvc += mb_stat.sum_mvc;
      stats.sum_mvc_abs += mb_stat.sum_mvc_abs;
      stats.sum_mvcs += mb_stat.sum_mvcs;
      stats.sum_mvr += mb_stat.sum_mvr;
      stats.sum_mvr_abs += mb_stat.sum_mvr_abs;
      stats.sum_mvrs += mb_stat.sum_mvrs;
    }
  }
  return stats;
}